

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O0

IterateResult __thiscall deqp::gls::UniformBlockCase::iterate(UniformBlockCase *this)

{
  allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *this_00;
  allocator<unsigned_char> *this_01;
  RenderContext *renderCtx;
  glUseProgramFunc p_Var1;
  glUniformBlockBindingFunc p_Var2;
  glBufferDataFunc p_Var3;
  glBindBufferRangeFunc p_Var4;
  GLuint GVar5;
  key_type kVar6;
  bool bVar7;
  int iVar8;
  deUint32 dVar9;
  GLenum GVar10;
  TestLog *log_00;
  undefined4 extraout_var;
  pointer pBVar11;
  size_type sVar12;
  reference pvVar13;
  mapped_type *ppvVar14;
  reference pvVar15;
  MessageBuilder *pMVar16;
  reference value;
  reference pvVar17;
  mapped_type *pmVar18;
  long lVar19;
  GLuint GStack_b34;
  bool renderOk;
  deUint32 binding_2;
  int blockNdx_7;
  deUint32 buffer_1;
  int blockNdx_6;
  map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> glBlockPointers_1
  ;
  undefined1 local_af0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> glData_1;
  undefined1 local_ad0 [4];
  int blockNdx_5;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> glBlockOffsets;
  int bindingAlignment;
  int numBlocks_1;
  int curOffset_1;
  int totalSize_1;
  deUint32 binding_1;
  deUint32 buffer;
  int blockNdx_4;
  int blockNdx_3;
  map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> glBlockPointers;
  undefined1 local_a48 [8];
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  glData;
  undefined1 local_a28 [4];
  int numBlocks;
  UniformBufferManager bufferManager;
  deUint32 binding;
  int blockNdx_2;
  int local_880;
  allocator<char> local_879;
  int uniformNdx;
  allocator<char> local_851;
  string local_850;
  LogSection local_830;
  MessageBuilder local_7f0;
  int local_670;
  allocator<char> local_669;
  int blockNdx_1;
  allocator<char> local_641;
  string local_640;
  LogSection local_620;
  undefined1 local_5e0 [8];
  UniformLayout glLayout;
  string local_5a8;
  string local_588;
  ProgramSources local_568;
  undefined1 local_498 [8];
  ShaderProgram program;
  ostringstream fragSrc;
  ostringstream local_250 [8];
  ostringstream vtxSrc;
  key_type local_d8;
  int local_d4;
  int blockNdx;
  int curOffset;
  __normal_iterator<deqp::gls::ub::BlockLayoutEntry_*,_std::vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>_>
  local_c8;
  __normal_iterator<deqp::gls::ub::BlockLayoutEntry_*,_std::vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>_>
  local_c0;
  __normal_iterator<const_deqp::gls::ub::BlockLayoutEntry_*,_std::vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>_>
  local_b8;
  const_iterator blockIter;
  int totalSize;
  undefined1 local_a0 [8];
  map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> blockPointers;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  UniformLayout refLayout;
  Functions *gl;
  TestLog *log;
  UniformBlockCase *this_local;
  Functions *gl_00;
  
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  iVar8 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar8);
  ub::UniformLayout::UniformLayout
            ((UniformLayout *)
             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &blockPointers._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>::map
            ((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *)
             local_a0);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  ub::anon_unknown_12::computeStd140Layout
            ((UniformLayout *)
             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&this->m_interface);
  blockIter._M_current._0_4_ = 0;
  local_c0._M_current =
       (BlockLayoutEntry *)
       std::
       vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>::
       begin((vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
              *)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
  __gnu_cxx::
  __normal_iterator<deqp::gls::ub::BlockLayoutEntry_const*,std::vector<deqp::gls::ub::BlockLayoutEntry,std::allocator<deqp::gls::ub::BlockLayoutEntry>>>
  ::__normal_iterator<deqp::gls::ub::BlockLayoutEntry*>
            ((__normal_iterator<deqp::gls::ub::BlockLayoutEntry_const*,std::vector<deqp::gls::ub::BlockLayoutEntry,std::allocator<deqp::gls::ub::BlockLayoutEntry>>>
              *)&local_b8,&local_c0);
  while( true ) {
    local_c8._M_current =
         (BlockLayoutEntry *)
         std::
         vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>::
         end((vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
              *)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
    bVar7 = __gnu_cxx::operator!=(&local_b8,&local_c8);
    if (!bVar7) break;
    pBVar11 = __gnu_cxx::
              __normal_iterator<const_deqp::gls::ub::BlockLayoutEntry_*,_std::vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>_>
              ::operator->(&local_b8);
    blockIter._M_current._0_4_ = pBVar11->size + (int)blockIter._M_current;
    _blockNdx = __gnu_cxx::
                __normal_iterator<const_deqp::gls::ub::BlockLayoutEntry_*,_std::vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>_>
                ::operator++(&local_b8,0);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &blockPointers._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (long)(int)blockIter._M_current);
  local_d4 = 0;
  for (local_d8 = 0; kVar6 = local_d8,
      sVar12 = std::
               vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
               ::size((vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                       *)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage), kVar6 < (int)sVar12;
      local_d8 = local_d8 + 1) {
    pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         &blockPointers._M_t._M_impl.super__Rb_tree_header._M_node_count,0);
    lVar19 = (long)local_d4;
    ppvVar14 = std::map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
               ::operator[]((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                             *)local_a0,&local_d8);
    *ppvVar14 = pvVar13 + lVar19;
    pvVar15 = std::
              vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
              ::operator[]((vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                            *)&data.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_d8);
    local_d4 = pvVar15->size + local_d4;
  }
  ub::anon_unknown_12::generateValues
            ((UniformLayout *)
             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *)
             local_a0,1);
  std::__cxx11::ostringstream::ostringstream(local_250);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&program.m_program.m_info.linkTimeUs);
  ub::anon_unknown_12::generateVertexShader
            ((ostringstream *)local_250,this->m_glslVersion,&this->m_interface,
             (UniformLayout *)
             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *)
             local_a0);
  ub::anon_unknown_12::generateFragmentShader
            ((ostringstream *)&program.m_program.m_info.linkTimeUs,this->m_glslVersion,
             &this->m_interface,
             (UniformLayout *)
             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *)
             local_a0);
  renderCtx = this->m_renderCtx;
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::str();
  glu::makeVtxFragSources(&local_568,&local_588,&local_5a8);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_498,renderCtx,&local_568);
  glu::ProgramSources::~ProgramSources(&local_568);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::__cxx11::string::~string((string *)&local_588);
  glu::operator<<(log_00,(ShaderProgram *)local_498);
  bVar7 = glu::ShaderProgram::isOk((ShaderProgram *)local_498);
  if (bVar7) {
    ub::UniformLayout::UniformLayout((UniformLayout *)local_5e0);
    dVar9 = glu::ShaderProgram::getProgram((ShaderProgram *)local_498);
    ub::anon_unknown_12::getGLUniformLayout(gl_00,(UniformLayout *)local_5e0,dVar9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_640,"ActiveUniformBlocks",&local_641);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&blockNdx_1,"Active Uniform Blocks",&local_669);
    tcu::LogSection::LogSection(&local_620,&local_640,(string *)&blockNdx_1);
    tcu::TestLog::operator<<(log_00,&local_620);
    tcu::LogSection::~LogSection(&local_620);
    std::__cxx11::string::~string((string *)&blockNdx_1);
    std::allocator<char>::~allocator(&local_669);
    std::__cxx11::string::~string((string *)&local_640);
    std::allocator<char>::~allocator(&local_641);
    for (local_670 = 0; iVar8 = local_670,
        sVar12 = std::
                 vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                 ::size((vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                         *)local_5e0), iVar8 < (int)sVar12; local_670 = local_670 + 1) {
      tcu::TestLog::operator<<(&local_7f0,log_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar16 = tcu::MessageBuilder::operator<<(&local_7f0,&local_670);
      pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,(char (*) [3])0xf96de6);
      pvVar15 = std::
                vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                ::operator[]((vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                              *)local_5e0,(long)local_670);
      pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,pvVar15);
      tcu::MessageBuilder::operator<<(pMVar16,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_7f0);
    }
    tcu::TestLog::operator<<(log_00,(EndSectionToken *)&tcu::TestLog::EndSection);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_850,"ActiveUniforms",&local_851);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&uniformNdx,"Active Uniforms",&local_879);
    tcu::LogSection::LogSection(&local_830,&local_850,(string *)&uniformNdx);
    tcu::TestLog::operator<<(log_00,&local_830);
    tcu::LogSection::~LogSection(&local_830);
    std::__cxx11::string::~string((string *)&uniformNdx);
    std::allocator<char>::~allocator(&local_879);
    std::__cxx11::string::~string((string *)&local_850);
    std::allocator<char>::~allocator(&local_851);
    for (local_880 = 0; iVar8 = local_880,
        sVar12 = std::
                 vector<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                 ::size((vector<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                         *)&glLayout.blocks.
                            super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage), iVar8 < (int)sVar12
        ; local_880 = local_880 + 1) {
      tcu::TestLog::operator<<
                ((MessageBuilder *)&binding,log_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar16 = tcu::MessageBuilder::operator<<((MessageBuilder *)&binding,&local_880);
      pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,(char (*) [3])0xf96de6);
      value = std::
              vector<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
              ::operator[]((vector<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                            *)&glLayout.blocks.
                               super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_880);
      pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,value);
      tcu::MessageBuilder::operator<<(pMVar16,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&binding);
    }
    tcu::TestLog::operator<<(log_00,(EndSectionToken *)&tcu::TestLog::EndSection);
    bVar7 = checkLayoutIndices(this,(UniformLayout *)local_5e0);
    if (((bVar7) && (bVar7 = checkLayoutBounds(this,(UniformLayout *)local_5e0), bVar7)) &&
       (bVar7 = compareTypes(this,(UniformLayout *)
                                  &data.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (UniformLayout *)local_5e0), bVar7)) {
      bVar7 = compareStd140Blocks(this,(UniformLayout *)
                                       &data.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (UniformLayout *)local_5e0);
      if (!bVar7) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                   "Invalid std140 layout");
      }
      bVar7 = compareSharedBlocks(this,(UniformLayout *)
                                       &data.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (UniformLayout *)local_5e0);
      if (!bVar7) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                   "Invalid shared layout");
      }
      dVar9 = glu::ShaderProgram::getProgram((ShaderProgram *)local_498);
      bVar7 = checkIndexQueries(this,dVar9,(UniformLayout *)local_5e0);
      if (!bVar7) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                   "Inconsintent block index query results");
      }
      p_Var1 = gl_00->useProgram;
      dVar9 = glu::ShaderProgram::getProgram((ShaderProgram *)local_498);
      (*p_Var1)(dVar9);
      for (bufferManager.m_buffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          GVar5 = bufferManager.m_buffers.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_,
          sVar12 = std::
                   vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                   ::size((vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                           *)local_5e0), (int)GVar5 < (int)sVar12;
          bufferManager.m_buffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
               bufferManager.m_buffers.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
        bufferManager.m_buffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
             bufferManager.m_buffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        p_Var2 = gl_00->uniformBlockBinding;
        dVar9 = glu::ShaderProgram::getProgram((ShaderProgram *)local_498);
        (*p_Var2)(dVar9,bufferManager.m_buffers.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_,
                  (GLuint)bufferManager.m_buffers.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      }
      GVar10 = (*gl_00->getError)();
      glu::checkError(GVar10,"Failed to set uniform block bindings",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                      ,0x5cf);
      ub::UniformBufferManager::UniformBufferManager
                ((UniformBufferManager *)local_a28,this->m_renderCtx);
      if (this->m_bufferMode == BUFFERMODE_PER_BLOCK) {
        sVar12 = std::
                 vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                 ::size((vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                         *)local_5e0);
        glData.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (int)sVar12;
        sVar12 = (size_type)
                 glData.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        this_00 = (allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                  ((long)&glBlockPointers._M_t._M_impl.super__Rb_tree_header._M_node_count + 7);
        std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::allocator
                  (this_00);
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  *)local_a48,sVar12,this_00);
        std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~allocator
                  ((allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)
                   ((long)&glBlockPointers._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
        std::map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>::map
                  ((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                    *)&blockNdx_4);
        for (buffer = 0;
            (int)buffer <
            glData.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; buffer = buffer + 1) {
          pvVar17 = std::
                    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)local_a48,(long)(int)buffer);
          pvVar15 = std::
                    vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                    ::operator[]((vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                                  *)local_5e0,(long)(int)buffer);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    (pvVar17,(long)pvVar15->size);
          pvVar17 = std::
                    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)local_a48,(long)(int)buffer);
          pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              (pvVar17,0);
          ppvVar14 = std::
                     map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                     ::operator[]((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                                   *)&blockNdx_4,(key_type *)&buffer);
          *ppvVar14 = pvVar13;
        }
        ub::anon_unknown_12::copyUniformData
                  ((UniformLayout *)local_5e0,
                   (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                    *)&blockNdx_4,
                   (UniformLayout *)
                   &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                   (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                    *)local_a0);
        for (binding_1 = 0;
            (int)binding_1 <
            glData.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; binding_1 = binding_1 + 1) {
          dVar9 = ub::UniformBufferManager::allocBuffer((UniformBufferManager *)local_a28);
          (*gl_00->bindBuffer)(0x8a11,dVar9);
          p_Var3 = gl_00->bufferData;
          pvVar17 = std::
                    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)local_a48,(long)(int)binding_1);
          sVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar17);
          pvVar17 = std::
                    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                  *)local_a48,(long)(int)binding_1);
          pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              (pvVar17,0);
          (*p_Var3)(0x8a11,sVar12,pvVar13,0x88e4);
          GVar10 = (*gl_00->getError)();
          glu::checkError(GVar10,"Failed to upload uniform buffer data",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                          ,0x5e8);
          (*gl_00->bindBufferBase)(0x8a11,binding_1,dVar9);
          GVar10 = (*gl_00->getError)();
          glu::checkError(GVar10,"glBindBufferBase(GL_UNIFORM_BUFFER) failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                          ,0x5eb);
        }
        std::map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>::~map
                  ((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                    *)&blockNdx_4);
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)local_a48);
      }
      else {
        sVar12 = std::
                 vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                 ::size((vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                         *)local_5e0);
        glBlockOffsets._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = (int)sVar12;
        glBlockOffsets._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
        std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
                  ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                   local_ad0);
        (*gl_00->getIntegerv)
                  (0x8a34,(GLint *)&glBlockOffsets._M_t._M_impl.super__Rb_tree_header._M_node_count)
        ;
        bindingAlignment = 0;
        for (glData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
            glData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ <
            glBlockOffsets._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
            glData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ =
                 glData_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
          if (0 < (int)glBlockOffsets._M_t._M_impl.super__Rb_tree_header._M_node_count) {
            bindingAlignment =
                 ub::anon_unknown_12::deRoundUp32
                           (bindingAlignment,
                            (int)glBlockOffsets._M_t._M_impl.super__Rb_tree_header._M_node_count);
          }
          pmVar18 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)local_ad0,
                                 (key_type *)
                                 ((long)&glData_1.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
          *pmVar18 = bindingAlignment;
          pvVar15 = std::
                    vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                    ::operator[]((vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                                  *)local_5e0,
                                 (long)glData_1.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          bindingAlignment = pvVar15->size + bindingAlignment;
        }
        this_01 = (allocator<unsigned_char> *)
                  ((long)&glBlockPointers_1._M_t._M_impl.super__Rb_tree_header._M_node_count + 7);
        std::allocator<unsigned_char>::allocator(this_01);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_af0,
                   (long)bindingAlignment,this_01);
        std::allocator<unsigned_char>::~allocator
                  ((allocator<unsigned_char> *)
                   ((long)&glBlockPointers_1._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
        std::map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>::map
                  ((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                    *)&buffer_1);
        for (blockNdx_7 = 0;
            blockNdx_7 < glBlockOffsets._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
            blockNdx_7 = blockNdx_7 + 1) {
          pmVar18 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)local_ad0,&blockNdx_7);
          pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_af0,
                               (long)*pmVar18);
          ppvVar14 = std::
                     map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                     ::operator[]((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                                   *)&buffer_1,&blockNdx_7);
          *ppvVar14 = pvVar13;
        }
        ub::anon_unknown_12::copyUniformData
                  ((UniformLayout *)local_5e0,
                   (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                    *)&buffer_1,
                   (UniformLayout *)
                   &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                   (map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                    *)local_a0);
        binding_2 = ub::UniformBufferManager::allocBuffer((UniformBufferManager *)local_a28);
        (*gl_00->bindBuffer)(0x8a11,binding_2);
        bVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_af0);
        if (!bVar7) {
          p_Var3 = gl_00->bufferData;
          sVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_af0);
          pvVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_af0,0)
          ;
          (*p_Var3)(0x8a11,sVar12,pvVar13,0x88e4);
        }
        GVar10 = (*gl_00->getError)();
        glu::checkError(GVar10,"Failed to upload uniform buffer data",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                        ,0x615);
        for (GStack_b34 = 0; dVar9 = binding_2, GVar5 = GStack_b34,
            (int)GStack_b34 < glBlockOffsets._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
            GStack_b34 = GStack_b34 + 1) {
          p_Var4 = gl_00->bindBufferRange;
          pmVar18 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)local_ad0,(key_type *)&stack0xfffffffffffff4cc);
          iVar8 = *pmVar18;
          pvVar15 = std::
                    vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                    ::operator[]((vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                                  *)local_5e0,(long)(int)GStack_b34);
          (*p_Var4)(0x8a11,GVar5,dVar9,(long)iVar8,(long)pvVar15->size);
          GVar10 = (*gl_00->getError)();
          glu::checkError(GVar10,"glBindBufferRange(GL_UNIFORM_BUFFER) failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                          ,0x61c);
        }
        std::map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>::~map
                  ((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
                    *)&buffer_1);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_af0);
        std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
                  ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                   local_ad0);
      }
      dVar9 = glu::ShaderProgram::getProgram((ShaderProgram *)local_498);
      bVar7 = render(this,dVar9);
      if (!bVar7) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                   "Image compare failed");
      }
      glLayout.uniforms.
      super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      ub::UniformBufferManager::~UniformBufferManager((UniformBufferManager *)local_a28);
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Invalid layout");
      glLayout.uniforms.
      super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    }
    ub::UniformLayout::~UniformLayout((UniformLayout *)local_5e0);
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Compile failed")
    ;
    glLayout.uniforms.
    super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_498);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&program.m_program.m_info.linkTimeUs)
  ;
  std::__cxx11::ostringstream::~ostringstream(local_250);
  std::map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>::~map
            ((map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_> *)
             local_a0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &blockPointers._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ub::UniformLayout::~UniformLayout
            ((UniformLayout *)
             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return STOP;
}

Assistant:

UniformBlockCase::IterateResult UniformBlockCase::iterate (void)
{
	TestLog&				log				= m_testCtx.getLog();
	const glw::Functions&	gl				= m_renderCtx.getFunctions();
	UniformLayout			refLayout;		//!< std140 layout.
	vector<deUint8>			data;			//!< Data.
	map<int, void*>			blockPointers;	//!< Reference block pointers.

	// Initialize result to pass.
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	// Compute reference layout.
	computeStd140Layout(refLayout, m_interface);

	// Assign storage for reference values.
	{
		int totalSize = 0;
		for (vector<BlockLayoutEntry>::const_iterator blockIter = refLayout.blocks.begin(); blockIter != refLayout.blocks.end(); blockIter++)
			totalSize += blockIter->size;
		data.resize(totalSize);

		// Pointers for each block.
		int curOffset = 0;
		for (int blockNdx = 0; blockNdx < (int)refLayout.blocks.size(); blockNdx++)
		{
			blockPointers[blockNdx] = &data[0] + curOffset;
			curOffset += refLayout.blocks[blockNdx].size;
		}
	}

	// Generate values.
	generateValues(refLayout, blockPointers, 1 /* seed */);

	// Generate shaders and build program.
	std::ostringstream vtxSrc;
	std::ostringstream fragSrc;

	generateVertexShader(vtxSrc, m_glslVersion, m_interface, refLayout, blockPointers);
	generateFragmentShader(fragSrc, m_glslVersion, m_interface, refLayout, blockPointers);

	glu::ShaderProgram program(m_renderCtx, glu::makeVtxFragSources(vtxSrc.str(), fragSrc.str()));
	log << program;

	if (!program.isOk())
	{
		// Compile failed.
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compile failed");
		return STOP;
	}

	// Query layout from GL.
	UniformLayout glLayout;
	getGLUniformLayout(gl, glLayout, program.getProgram());

	// Print layout to log.
	log << TestLog::Section("ActiveUniformBlocks", "Active Uniform Blocks");
	for (int blockNdx = 0; blockNdx < (int)glLayout.blocks.size(); blockNdx++)
		log << TestLog::Message << blockNdx << ": " << glLayout.blocks[blockNdx] << TestLog::EndMessage;
	log << TestLog::EndSection;

	log << TestLog::Section("ActiveUniforms", "Active Uniforms");
	for (int uniformNdx = 0; uniformNdx < (int)glLayout.uniforms.size(); uniformNdx++)
		log << TestLog::Message << uniformNdx << ": " << glLayout.uniforms[uniformNdx] << TestLog::EndMessage;
	log << TestLog::EndSection;

	// Check that we can even try rendering with given layout.
	if (!checkLayoutIndices(glLayout) || !checkLayoutBounds(glLayout) || !compareTypes(refLayout, glLayout))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid layout");
		return STOP; // It is not safe to use the given layout.
	}

	// Verify all std140 blocks.
	if (!compareStd140Blocks(refLayout, glLayout))
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid std140 layout");

	// Verify all shared blocks - all uniforms should be active, and certain properties match.
	if (!compareSharedBlocks(refLayout, glLayout))
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid shared layout");

	// Check consistency with index queries
	if (!checkIndexQueries(program.getProgram(), glLayout))
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Inconsintent block index query results");

	// Use program.
	gl.useProgram(program.getProgram());

	// Assign binding points to all active uniform blocks.
	for (int blockNdx = 0; blockNdx < (int)glLayout.blocks.size(); blockNdx++)
	{
		deUint32 binding = (deUint32)blockNdx; // \todo [2012-01-25 pyry] Randomize order?
		gl.uniformBlockBinding(program.getProgram(), (deUint32)blockNdx, binding);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to set uniform block bindings");

	// Allocate buffers, write data and bind to targets.
	UniformBufferManager bufferManager(m_renderCtx);
	if (m_bufferMode == BUFFERMODE_PER_BLOCK)
	{
		int							numBlocks			= (int)glLayout.blocks.size();
		vector<vector<deUint8> >	glData				(numBlocks);
		map<int, void*>				glBlockPointers;

		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			glData[blockNdx].resize(glLayout.blocks[blockNdx].size);
			glBlockPointers[blockNdx] = &glData[blockNdx][0];
		}

		copyUniformData(glLayout, glBlockPointers, refLayout, blockPointers);

		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			deUint32	buffer	= bufferManager.allocBuffer();
			deUint32	binding	= (deUint32)blockNdx;

			gl.bindBuffer(GL_UNIFORM_BUFFER, buffer);
			gl.bufferData(GL_UNIFORM_BUFFER, (glw::GLsizeiptr)glData[blockNdx].size(), &glData[blockNdx][0], GL_STATIC_DRAW);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to upload uniform buffer data");

			gl.bindBufferBase(GL_UNIFORM_BUFFER, binding, buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase(GL_UNIFORM_BUFFER) failed");
		}
	}
	else
	{
		DE_ASSERT(m_bufferMode == BUFFERMODE_SINGLE);

		int				totalSize			= 0;
		int				curOffset			= 0;
		int				numBlocks			= (int)glLayout.blocks.size();
		int				bindingAlignment	= 0;
		map<int, int>	glBlockOffsets;

		gl.getIntegerv(GL_UNIFORM_BUFFER_OFFSET_ALIGNMENT, &bindingAlignment);

		// Compute total size and offsets.
		curOffset = 0;
		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			if (bindingAlignment > 0)
				curOffset = deRoundUp32(curOffset, bindingAlignment);
			glBlockOffsets[blockNdx] = curOffset;
			curOffset += glLayout.blocks[blockNdx].size;
		}
		totalSize = curOffset;

		// Assign block pointers.
		vector<deUint8>	glData(totalSize);
		map<int, void*>	glBlockPointers;

		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
			glBlockPointers[blockNdx] = &glData[glBlockOffsets[blockNdx]];

		// Copy to gl format.
		copyUniformData(glLayout, glBlockPointers, refLayout, blockPointers);

		// Allocate buffer and upload data.
		deUint32 buffer = bufferManager.allocBuffer();
		gl.bindBuffer(GL_UNIFORM_BUFFER, buffer);
		if (!glData.empty())
			gl.bufferData(GL_UNIFORM_BUFFER, (glw::GLsizeiptr)glData.size(), &glData[0], GL_STATIC_DRAW);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to upload uniform buffer data");

		// Bind ranges to binding points.
		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			deUint32 binding = (deUint32)blockNdx;
			gl.bindBufferRange(GL_UNIFORM_BUFFER, binding, buffer, (glw::GLintptr)glBlockOffsets[blockNdx], (glw::GLsizeiptr)glLayout.blocks[blockNdx].size);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferRange(GL_UNIFORM_BUFFER) failed");
		}
	}

	bool renderOk = render(program.getProgram());
	if (!renderOk)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image compare failed");

	return STOP;
}